

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialization_pipeline<ExtIsoForest,char_const*>(ExtIsoForest *model,char **in)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  runtime_error *prVar4;
  byte bVar5;
  PlatformSize PVar6;
  bool lacks_range_penalty;
  bool lacks_scoring_metric;
  bool has_same_endianness;
  bool has_same_size_t_size;
  bool has_same_int_size;
  size_t size_model;
  bool lacks_indexer;
  vector<char,_std::allocator<char>_> buffer;
  PlatformSize saved_size_t;
  PlatformSize saved_int_t;
  SignalSwitcher ss;
  PlatformEndianness saved_endian;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  SignalSwitcher::SignalSwitcher(&ss);
  check_setup_info<char_const*>
            (in,&has_same_int_size,&has_same_size_t_size,&has_same_endianness,&saved_int_t,
             &saved_size_t,&saved_endian,&lacks_range_penalty,&lacks_scoring_metric,&lacks_indexer);
  pcVar2 = *in;
  cVar1 = *pcVar2;
  *in = pcVar2 + 1;
  if (cVar1 != '\x02') {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Object to de-serialize does not match with the supplied type.\n");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((((has_same_int_size == false) || (has_same_size_t_size != true)) ||
      ((has_same_endianness & 1U) == 0)) ||
     ((lacks_range_penalty != false || (lacks_scoring_metric != false)))) {
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar5 = has_same_endianness ^ 1;
    PVar6 = saved_size_t ^ Is32Bit;
    if ((saved_int_t ^ Is16Bit) == 0 && PVar6 == 0) {
      read_bytes<unsigned_long,unsigned_int>(&size_model,1,in,&buffer,(bool)(bVar5 & 1));
      deserialize_model<char_const*,short,unsigned_int>
                (model,in,&buffer,(bool)(bVar5 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else if ((saved_int_t ^ Is32Bit) == 0 && PVar6 == 0) {
      read_bytes<unsigned_long,unsigned_int>(&size_model,1,in,&buffer,(bool)(bVar5 & 1));
      deserialize_model<char_const*,int,unsigned_int>
                (model,in,&buffer,(bool)(bVar5 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else if (saved_int_t == Is64Bit && PVar6 == 0) {
      read_bytes<unsigned_long,unsigned_int>(&size_model,1,in,&buffer,(bool)(bVar5 & 1));
      deserialize_model<char_const*,long,unsigned_int>
                (model,in,&buffer,(bool)(bVar5 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else if ((saved_int_t ^ Is16Bit) == 0 && (saved_size_t ^ Is64Bit) == 0) {
      size_model = *(size_t *)(pcVar2 + 1);
      *in = pcVar2 + 9;
      if ((has_same_endianness & 1U) == 0) {
        swap_endianness<unsigned_long>(&size_model,1);
      }
      deserialize_model<char_const*,short,unsigned_long>
                (model,in,&buffer,(bool)(bVar5 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else if ((saved_int_t ^ Is32Bit) == 0 && (saved_size_t ^ Is64Bit) == 0) {
      size_model = *(size_t *)(pcVar2 + 1);
      *in = pcVar2 + 9;
      if ((has_same_endianness & 1U) == 0) {
        swap_endianness<unsigned_long>(&size_model,1);
      }
      deserialize_model<char_const*,int,unsigned_long>
                (model,in,&buffer,(bool)(bVar5 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else {
      if ((saved_int_t != Is64Bit) || (saved_size_t != Is64Bit)) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"Unexpected error in ","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/serialize.cpp"
                   ,"");
        std::operator+(&local_b0,&local_150,&local_f0);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,":","");
        std::operator+(&local_90,&local_b0,&local_110);
        std::__cxx11::to_string(&local_d0,0x872);
        std::operator+(&local_70,&local_90,&local_d0);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                   ,"");
        std::operator+(&local_50,&local_70,&local_130);
        std::runtime_error::runtime_error(prVar4,(string *)&local_50);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      size_model = *(size_t *)(pcVar2 + 1);
      *in = pcVar2 + 9;
      if ((has_same_endianness & 1U) == 0) {
        swap_endianness<unsigned_long>(&size_model,1);
      }
      deserialize_model<char_const*,long,unsigned_long>
                (model,in,&buffer,(bool)(bVar5 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    size_model = *(size_t *)(pcVar2 + 1);
    *in = pcVar2 + 9;
    deserialize_model<char_const*>(model,in);
  }
  check_interrupt_switch(&ss);
  if (lacks_range_penalty == true) {
    bVar3 = check_model_has_range_penalty(model);
    model->has_range_penalty = bVar3;
    check_interrupt_switch(&ss);
  }
  *in = *in + 9;
  SignalSwitcher::~SignalSwitcher(&ss);
  return;
}

Assistant:

void deserialization_pipeline(Model &model, itype &in)
{
    SignalSwitcher ss = SignalSwitcher();

    bool has_same_int_size;
    bool has_same_size_t_size;
    bool has_same_endianness;
    PlatformSize saved_int_t;
    PlatformSize saved_size_t;
    PlatformEndianness saved_endian;
    bool lacks_range_penalty;
    bool lacks_scoring_metric;
    bool lacks_indexer; /* <- ignored */

    check_setup_info(
        in,
        has_same_int_size,
        has_same_size_t_size,
        has_same_endianness,
        saved_int_t,
        saved_size_t,
        saved_endian,
        lacks_range_penalty,
        lacks_scoring_metric,
        lacks_indexer
    );

    uint8_t model_type = get_model_code(model);
    uint8_t model_in;
    read_bytes<uint8_t>((void*)&model_in, (size_t)1, in);
    if (model_type != model_in)
        throw std::runtime_error("Object to de-serialize does not match with the supplied type.\n");

    size_t size_model;
    if (has_same_int_size && has_same_size_t_size && has_same_endianness && !lacks_range_penalty && !lacks_scoring_metric)
    {
        read_bytes<size_t>((void*)&size_model, (size_t)1, in);
        deserialize_model(model, in);
    }
    
    else
    {
        std::vector<char> buffer;
        const bool diff_endian = !has_same_endianness;

        if (saved_int_t == Is16Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int16_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is32Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int32_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is64Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int64_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is16Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is32Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int32_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is64Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int64_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else
        {
            unexpected_error();
        }
    }

    check_interrupt_switch(ss);

    if (lacks_range_penalty)
    {
        add_range_penalty(model);
        check_interrupt_switch(ss);
    }

    /* Not currently used, but left in case the format changes */
    uint8_t ending_type;
    read_bytes<uint8_t>((void*)&ending_type, (size_t)1, in);
    size_t jump_ahead;
    read_bytes<size_t>((void*)&jump_ahead, (size_t)1, in);
}